

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

void __thiscall
QGlobalNetworkProxy::setApplicationProxy(QGlobalNetworkProxy *this,QNetworkProxy *proxy)

{
  long lVar1;
  void *pvVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QRecursiveMutex> lock;
  QRecursiveMutex *in_stack_ffffffffffffffb8;
  QMutexLocker<QRecursiveMutex> *in_stack_ffffffffffffffc0;
  QMutexLocker<QRecursiveMutex> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QRecursiveMutex>::QMutexLocker(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(long *)(in_RDI + 0x18) == 0) {
    pvVar2 = operator_new(8);
    QNetworkProxy::QNetworkProxy((QNetworkProxy *)0x24d42f);
    *(void **)(in_RDI + 0x18) = pvVar2;
  }
  QNetworkProxy::operator=
            ((QNetworkProxy *)in_stack_ffffffffffffffc0,(QNetworkProxy *)in_stack_ffffffffffffffb8);
  this_00 = *(QMutexLocker<QRecursiveMutex> **)(in_RDI + 0x20);
  if (this_00 != (QMutexLocker<QRecursiveMutex> *)0x0) {
    (**(code **)&this_00->m_mutex->count)();
  }
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined1 *)(in_RDI + 0x38) = 0;
  QMutexLocker<QRecursiveMutex>::~QMutexLocker(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setApplicationProxy(const QNetworkProxy &proxy)
    {
        QMutexLocker lock(&mutex);
        if (!applicationLevelProxy)
            applicationLevelProxy = new QNetworkProxy;
        *applicationLevelProxy = proxy;
        delete applicationLevelProxyFactory;
        applicationLevelProxyFactory = nullptr;
        useSystemProxies = false;
    }